

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  float local_30;
  ImGuiWindow *window;
  float wrap_pos_x_local;
  ImVec2 *pos_local;
  
  if (0.0 <= wrap_pos_x) {
    pIVar1 = GetCurrentWindowRead();
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      window._4_4_ = wrap_pos_x;
      if (0.0 < wrap_pos_x) {
        window._4_4_ = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + wrap_pos_x;
      }
    }
    else {
      IVar2 = GetContentRegionMax();
      local_30 = IVar2.x;
      window._4_4_ = local_30 + (pIVar1->Pos).x;
    }
    pos_local._4_4_ = ImMax(window._4_4_ - pos->x,1.0);
  }
  else {
    pos_local._4_4_ = 0.0;
  }
  return pos_local._4_4_;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GetCurrentWindowRead();
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = GetContentRegionMax().x + window->Pos.x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}